

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cxx17_string_view.cpp
# Opt level: O0

void __thiscall
iu_StringViewSplit_x_iutest_x_chain_at_first_by_stl_str_view_Test<char16_t>::Body
          (iu_StringViewSplit_x_iutest_x_chain_at_first_by_stl_str_view_Test<char16_t> *this)

{
  char16_t **this_00;
  bool bVar1;
  char16_t *pcVar2;
  char *pcVar3;
  const_reference pvVar4;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> *in_R9;
  AssertionHelper local_6e8;
  Fixed local_6b8;
  char16_t *local_530;
  undefined1 local_528 [8];
  AssertionResult iutest_ar_2;
  Fixed local_4d0;
  char16_t *local_348;
  undefined1 local_340 [8];
  AssertionResult iutest_ar_1;
  string local_310;
  AssertionHelper local_2f0;
  Fixed local_2c0;
  size_type local_128;
  uint local_120;
  ExpressionDecomposer local_119;
  ExpressionLHS<unsigned_int> local_118;
  ExpressionResult local_f0;
  AssertionResult local_c8;
  undefined1 local_a0 [8];
  AssertionResult iutest_ar;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> local_70;
  b_str_view<char_type>_conflict1 local_60;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> local_50;
  undefined1 local_40 [8];
  array<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_2UL> re;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> s;
  iu_StringViewSplit_x_iutest_x_chain_at_first_by_stl_str_view_Test<char16_t> *this_local;
  
  pcVar2 = constant::arikitari_na_world_underscore<char16_t>();
  this_00 = &re._M_elems[1]._M_str;
  std::basic_string_view<char16_t,_std::char_traits<char16_t>_>::basic_string_view
            ((basic_string_view<char16_t,_std::char_traits<char16_t>_> *)this_00,pcVar2);
  pcVar2 = constant::space_underscore<char16_t>();
  std::basic_string_view<char16_t,_std::char_traits<char16_t>_>::basic_string_view(&local_70,pcVar2)
  ;
  local_60 = (b_str_view<char_type>_conflict1)
             split<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_nullptr>(local_70)
  ;
  at_first();
  local_50 = (basic_string_view<char16_t,_std::char_traits<char16_t>_>)
             detail::
             split_helper<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_false,_false,_false>
             ::operator>><detail::split_at_first,_nullptr>
                       ((split_helper<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_false,_false,_false>
                         *)&local_60);
  detail::
  operator|<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_char16_t,_nullptr>
            ((array<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_2UL> *)local_40,
             (basic_string_view<char16_t,_std::char_traits<char16_t>_> *)this_00,
             (split_helper_subroutine<detail::split_at_first,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_char16_t>
              *)&local_50);
  iutest::detail::AlwaysZero();
  local_120 = 2;
  iutest::detail::ExpressionDecomposer::operator->*(&local_118,&local_119,&local_120);
  local_128 = std::array<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_2UL>::size
                        ((array<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_2UL>
                          *)local_40);
  iutest::detail::ExpressionLHS<unsigned_int>::operator==(&local_f0,&local_118,&local_128);
  iutest::detail::ExpressionResult::GetResult(&local_c8,&local_f0,true);
  iutest::AssertionResult::Is((AssertionResult *)local_a0,&local_c8);
  iutest::AssertionResult::~AssertionResult(&local_c8);
  iutest::detail::ExpressionResult::~ExpressionResult(&local_f0);
  iutest::detail::ExpressionLHS<unsigned_int>::~ExpressionLHS(&local_118);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    memset(&local_2c0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_2c0);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_310,(internal *)local_a0,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((2u == re.size()))",
               "false","true",(char *)in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iutest::AssertionHelper::AssertionHelper
              (&local_2f0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_cxx17_string_view.cpp"
               ,0x8c,pcVar3,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_2f0,&local_2c0);
    iutest::AssertionHelper::~AssertionHelper(&local_2f0);
    std::__cxx11::string::~string((string *)&local_310);
    iutest::AssertionHelper::Fixed::~Fixed(&local_2c0);
  }
  iutest_ar_1._37_3_ = 0;
  iutest_ar_1._36_1_ = !bVar1;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  if (iutest_ar_1._36_4_ == 0) {
    iutest::detail::AlwaysZero();
    local_348 = constant::arikitari<char16_t>();
    pvVar4 = std::array<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_2UL>::
             operator[]((array<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_2UL> *
                        )local_40,0);
    iutest::internal::EqHelper<false>::
    Compare<char16_t_const*,std::basic_string_view<char16_t,std::char_traits<char16_t>>>
              ((AssertionResult *)local_340,(EqHelper<false> *)"constant::arikitari<char_type>()",
               "re[0]",(char *)&local_348,(char16_t **)pvVar4,in_R9);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_340);
    if (!bVar1) {
      memset(&local_4d0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_4d0);
      pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_340);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&iutest_ar_2.m_result,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_cxx17_string_view.cpp"
                 ,0x8d,pcVar3,kFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_2.m_result,&local_4d0);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_2.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_4d0);
    }
    iutest_ar_1._37_3_ = 0;
    iutest_ar_1._36_1_ = !bVar1;
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_340);
    if (iutest_ar_1._36_4_ == 0) {
      iutest::detail::AlwaysZero();
      local_530 = constant::na_world<char16_t>();
      pvVar4 = std::array<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_2UL>::
               operator[]((array<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_2UL>
                           *)local_40,1);
      iutest::internal::EqHelper<false>::
      Compare<char16_t_const*,std::basic_string_view<char16_t,std::char_traits<char16_t>>>
                ((AssertionResult *)local_528,(EqHelper<false> *)"constant::na_world<char_type>()",
                 "re[1]",(char *)&local_530,(char16_t **)pvVar4,in_R9);
      bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_528);
      if (!bVar1) {
        memset(&local_6b8,0,0x188);
        iutest::AssertionHelper::Fixed::Fixed(&local_6b8);
        pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_528);
        iutest::AssertionHelper::AssertionHelper
                  (&local_6e8,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_cxx17_string_view.cpp"
                   ,0x8e,pcVar3,kFatalFailure);
        iutest::AssertionHelper::operator=(&local_6e8,&local_6b8);
        iutest::AssertionHelper::~AssertionHelper(&local_6e8);
        iutest::AssertionHelper::Fixed::~Fixed(&local_6b8);
      }
      iutest_ar_1._37_3_ = 0;
      iutest_ar_1._36_1_ = !bVar1;
      iutest::AssertionResult::~AssertionResult((AssertionResult *)local_528);
    }
  }
  return;
}

Assistant:

IUTEST_TYPED_TEST(StringViewSplit, chain_at_first_by_stl_str_view)
{
	using char_type = TypeParam;
	const std::basic_string_view<char_type> s = constant::arikitari_na_world_underscore<char_type>();
	const auto re = s | split(std::basic_string_view<char_type>(constant::space_underscore<char_type>())) >> at_first();
	IUTEST_ASSERT(2u == re.size());
	IUTEST_ASSERT_EQ(constant::arikitari<char_type>(), re[0]);
	IUTEST_ASSERT_EQ(constant::na_world<char_type>(), re[1]);
}